

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_number.hpp
# Opt level: O2

type __thiscall
jsoncons::detail::hex_to_integer<long,char>(detail *this,char *s,size_t length,long *n)

{
  assertion_error *this_00;
  undefined4 uVar1;
  ulong uVar3;
  byte bVar4;
  detail *pdVar5;
  long lVar6;
  type tVar7;
  allocator<char> local_39;
  string local_38;
  undefined7 uVar2;
  
  if (s == (char *)0x0) {
    this_00 = (assertion_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"assertion \'length > 0\' failed at  <> :0",&local_39);
    assertion_error::assertion_error(this_00,&local_38);
    __cxa_throw(this_00,&assertion_error::typeinfo,std::runtime_error::~runtime_error);
  }
  *(undefined8 *)length = 0;
  pdVar5 = (detail *)(s + (long)this);
  if (*this == (detail)0x2d) {
    lVar6 = 0;
    for (this = this + 1; this < pdVar5; this = this + 1) {
      bVar4 = (char)*this - 0x30;
      uVar2 = (undefined7)((ulong)n >> 8);
      uVar1 = (undefined4)CONCAT71(uVar2,2);
      if ((0x36 < bVar4) || ((0x7e0000007e03ffU >> ((ulong)bVar4 & 0x3f) & 1) == 0))
      goto LAB_001e295d;
      n = (long *)CONCAT71(uVar2,1);
      uVar1 = SUB84(n,0);
      if (lVar6 < -0x800000000000000) goto LAB_001e295d;
      uVar3 = (ulong)((uint)(byte)*this + *(int *)(&DAT_00667390 + (ulong)bVar4 * 8));
      lVar6 = lVar6 * 0x10;
      *(long *)length = lVar6;
      if (lVar6 < (long)(uVar3 + 0x8000000000000000)) goto LAB_001e295d;
      lVar6 = lVar6 - uVar3;
      *(long *)length = lVar6;
    }
  }
  else {
    lVar6 = 0;
    for (; this < pdVar5; this = this + 1) {
      bVar4 = (char)*this - 0x30;
      uVar2 = (undefined7)((ulong)n >> 8);
      uVar1 = (undefined4)CONCAT71(uVar2,2);
      if ((0x36 < bVar4) || ((0x7e0000007e03ffU >> ((ulong)bVar4 & 0x3f) & 1) == 0))
      goto LAB_001e295d;
      n = (long *)CONCAT71(uVar2,1);
      uVar1 = SUB84(n,0);
      if (0x7ffffffffffffff < lVar6) goto LAB_001e295d;
      uVar3 = (ulong)((uint)(byte)*this + *(int *)(&DAT_00667390 + (ulong)bVar4 * 8));
      lVar6 = lVar6 * 0x10;
      *(long *)length = lVar6;
      if ((long)(uVar3 ^ 0x7fffffffffffffff) < lVar6) goto LAB_001e295d;
      lVar6 = lVar6 + uVar3;
      *(long *)length = lVar6;
    }
  }
  uVar1 = 0;
LAB_001e295d:
  tVar7._8_4_ = uVar1;
  tVar7.ptr = (char *)this;
  tVar7._12_4_ = 0;
  return tVar7;
}

Assistant:

typename std::enable_if<ext_traits::integer_limits<T>::is_specialized && ext_traits::integer_limits<T>::is_signed,to_integer_result<T,CharT>>::type
hex_to_integer(const CharT* s, std::size_t length, T& n)
{
    static_assert(ext_traits::integer_limits<T>::is_specialized, "Integer type not specialized");
    JSONCONS_ASSERT(length > 0);

    n = 0;

    const CharT* end = s + length; 
    if (*s == '-')
    {
        static constexpr T min_value = (ext_traits::integer_limits<T>::lowest)();
        static constexpr T min_value_div_16 = min_value / 16;
        ++s;
        for (; s < end; ++s)
        {
            CharT c = *s;
            T x = 0;
            switch (c)
            {
                case '0':case '1':case '2':case '3':case '4':case '5':case '6':case '7':case '8': case '9':
                    x = c - '0';
                    break;
                case 'a':case 'b':case 'c':case 'd':case 'e':case 'f':
                    x = c - ('a' - 10);
                    break;
                case 'A':case 'B':case 'C':case 'D':case 'E':case 'F':
                    x = c - ('A' - 10);
                    break;
                default:
                    return to_integer_result<T,CharT>(s, to_integer_errc::invalid_digit);
            }
            if (n < min_value_div_16)
            {
                return to_integer_result<T,CharT>(s, to_integer_errc::overflow);
            }
            n = n * 16;
            if (n < min_value + x)
            {
                return to_integer_result<T,CharT>(s, to_integer_errc::overflow);
            }
            n -= x;
        }
    }
    else
    {
        static constexpr T max_value = (ext_traits::integer_limits<T>::max)();
        static constexpr T max_value_div_16 = max_value / 16;
        for (; s < end; ++s)
        {
            CharT c = *s;
            T x = 0;
            switch (c)
            {
                case '0':case '1':case '2':case '3':case '4':case '5':case '6':case '7':case '8': case '9':
                    x = c - '0';
                    break;
                case 'a':case 'b':case 'c':case 'd':case 'e':case 'f':
                    x = c - ('a' - 10);
                    break;
                case 'A':case 'B':case 'C':case 'D':case 'E':case 'F':
                    x = c - ('A' - 10);
                    break;
                default:
                    return to_integer_result<T,CharT>(s, to_integer_errc::invalid_digit);
            }
            if (n > max_value_div_16)
            {
                return to_integer_result<T,CharT>(s, to_integer_errc::overflow);
            }
            n = n * 16;
            if (n > max_value - x)
            {
                return to_integer_result<T,CharT>(s, to_integer_errc::overflow);
            }

            n += x;
        }
    }

    return to_integer_result<T,CharT>(s, to_integer_errc());
}